

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

bool __thiscall
glslang::TInputScanner::scanVersion
          (TInputScanner *this,int *version,EProfile *profile,bool *notFirstToken)

{
  int iVar1;
  bool bVar2;
  bool local_5c;
  bool local_5b;
  int local_50;
  char local_49;
  int profileLength;
  char profileString [13];
  int maxProfileLength;
  int c;
  bool lookingInMiddle;
  bool foundNonSpaceTab;
  bool versionNotFirst;
  bool *notFirstToken_local;
  EProfile *profile_local;
  int *version_local;
  TInputScanner *this_local;
  
  maxProfileLength._3_1_ = 0;
  *notFirstToken = false;
  *version = 0;
  *profile = ENoProfile;
  maxProfileLength._2_1_ = 0;
  maxProfileLength._1_1_ = 0;
  _c = notFirstToken;
  notFirstToken_local = (bool *)profile;
  profile_local = (EProfile *)version;
  version_local = (int *)this;
  do {
    if ((maxProfileLength._1_1_ & 1) != 0) {
      *_c = true;
      iVar1 = peek(this);
      if ((iVar1 != 10) && (iVar1 = peek(this), iVar1 != 0xd)) {
        do {
          profileString._9_4_ = get(this);
          bVar2 = false;
          if ((profileString._9_4_ != -1) && (bVar2 = false, profileString._9_4_ != 10)) {
            bVar2 = profileString._9_4_ != 0xd;
          }
        } while (bVar2);
      }
      while( true ) {
        iVar1 = peek(this);
        bVar2 = true;
        if (iVar1 != 10) {
          iVar1 = peek(this);
          bVar2 = iVar1 == 0xd;
        }
        if (!bVar2) break;
        get(this);
      }
      iVar1 = peek(this);
      if (iVar1 == -1) {
        return true;
      }
    }
    maxProfileLength._1_1_ = 1;
    consumeWhitespaceComment(this,(bool *)((long)&maxProfileLength + 2));
    if ((maxProfileLength._2_1_ & 1) != 0) {
      maxProfileLength._3_1_ = 1;
    }
    iVar1 = get(this);
    if (iVar1 == 0x23) {
      do {
        profileString._9_4_ = get(this);
        local_5b = profileString._9_4_ == 0x20 || profileString._9_4_ == 9;
      } while (local_5b);
      if (((((profileString._9_4_ == 0x76) && (iVar1 = get(this), iVar1 == 0x65)) &&
           (iVar1 = get(this), iVar1 == 0x72)) &&
          ((iVar1 = get(this), iVar1 == 0x73 && (iVar1 = get(this), iVar1 == 0x69)))) &&
         ((iVar1 = get(this), iVar1 == 0x6f && (iVar1 = get(this), iVar1 == 0x6e)))) {
        do {
          profileString._9_4_ = get(this);
          local_5c = profileString._9_4_ == 0x20 || profileString._9_4_ == 9;
        } while (local_5c);
        while (0x2f < (int)profileString._9_4_ && (int)profileString._9_4_ < 0x3a) {
          *profile_local = *profile_local * 10 + profileString._9_4_ + -0x30;
          profileString._9_4_ = get(this);
        }
        if (*profile_local != EBadProfile) {
          while (profileString._9_4_ == 0x20 || profileString._9_4_ == 9) {
            profileString._9_4_ = get(this);
          }
          profileString[5] = '\r';
          profileString[6] = '\0';
          profileString[7] = '\0';
          profileString[8] = '\0';
          local_50 = 0;
          while (((local_50 < 0xd && (profileString._9_4_ != -1)) &&
                 ((profileString._9_4_ != 0x20 &&
                  (((profileString._9_4_ != 9 && (profileString._9_4_ != 10)) &&
                   (profileString._9_4_ != 0xd))))))) {
            (&local_49)[local_50] = (char)profileString._9_4_;
            profileString._9_4_ = get(this);
            local_50 = local_50 + 1;
          }
          if (((profileString._9_4_ == -1) || (profileString._9_4_ == 0x20)) ||
             ((profileString._9_4_ == 9 ||
              ((profileString._9_4_ == 10 || (profileString._9_4_ == 0xd)))))) {
            if ((local_50 == 2) && (iVar1 = strncmp(&local_49,"es",2), iVar1 == 0)) {
              notFirstToken_local[0] = true;
              notFirstToken_local[1] = false;
              notFirstToken_local[2] = false;
              notFirstToken_local[3] = false;
            }
            else if ((local_50 == 4) && (iVar1 = strncmp(&local_49,"core",4), iVar1 == 0)) {
              notFirstToken_local[0] = true;
              notFirstToken_local[1] = false;
              notFirstToken_local[2] = false;
              notFirstToken_local[3] = false;
            }
            else if ((local_50 == 0xd) &&
                    (iVar1 = strncmp(&local_49,"compatibility",0xd), iVar1 == 0)) {
              notFirstToken_local[0] = true;
              notFirstToken_local[1] = false;
              notFirstToken_local[2] = false;
              notFirstToken_local[3] = false;
            }
            return (bool)(maxProfileLength._3_1_ & 1);
          }
        }
      }
    }
    maxProfileLength._3_1_ = 1;
  } while( true );
}

Assistant:

bool TInputScanner::scanVersion(int& version, EProfile& profile, bool& notFirstToken)
{
    // This function doesn't have to get all the semantics correct,
    // just find the #version if there is a correct one present.
    // The preprocessor will have the responsibility of getting all the semantics right.

    bool versionNotFirst = false;  // means not first WRT comments and white space, nothing more
    notFirstToken = false;         // means not first WRT to real tokens
    version = 0;                   // means not found
    profile = ENoProfile;

    bool foundNonSpaceTab = false;
    bool lookingInMiddle = false;
    int c;
    do {
        if (lookingInMiddle) {
            notFirstToken = true;
            // make forward progress by finishing off the current line plus extra new lines
            if (peek() != '\n' && peek() != '\r') {
                do {
                    c = get();
                } while (c != EndOfInput && c != '\n' && c != '\r');
            }
            while (peek() == '\n' || peek() == '\r')
                get();
            if (peek() == EndOfInput)
                return true;
        }
        lookingInMiddle = true;

        // Nominal start, skipping the desktop allowed comments and white space, but tracking if
        // something else was found for ES:
        consumeWhitespaceComment(foundNonSpaceTab);
        if (foundNonSpaceTab)
            versionNotFirst = true;

        // "#"
        if (get() != '#') {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        do {
            c = get();
        } while (c == ' ' || c == '\t');

        // "version"
        if (    c != 'v' ||
            get() != 'e' ||
            get() != 'r' ||
            get() != 's' ||
            get() != 'i' ||
            get() != 'o' ||
            get() != 'n') {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        do {
            c = get();
        } while (c == ' ' || c == '\t');

        // version number
        while (c >= '0' && c <= '9') {
            version = 10 * version + (c - '0');
            c = get();
        }
        if (version == 0) {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        while (c == ' ' || c == '\t')
            c = get();

        // profile
        const int maxProfileLength = 13;  // not including any 0
        char profileString[maxProfileLength];
        int profileLength;
        for (profileLength = 0; profileLength < maxProfileLength; ++profileLength) {
            if (c == EndOfInput || c == ' ' || c == '\t' || c == '\n' || c == '\r')
                break;
            profileString[profileLength] = (char)c;
            c = get();
        }
        if (c != EndOfInput && c != ' ' && c != '\t' && c != '\n' && c != '\r') {
            versionNotFirst = true;
            continue;
        }

        if (profileLength == 2 && strncmp(profileString, "es", profileLength) == 0)
            profile = EEsProfile;
        else if (profileLength == 4 && strncmp(profileString, "core", profileLength) == 0)
            profile = ECoreProfile;
        else if (profileLength == 13 && strncmp(profileString, "compatibility", profileLength) == 0)
            profile = ECompatibilityProfile;

        return versionNotFirst;
    } while (true);
}